

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

ValueBufferLayout *
vkt::anon_unknown_0::computeStd140Layout
          (ValueBufferLayout *__return_storage_ptr__,
          vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values)

{
  ulong uVar1;
  int vecSize_00;
  deInt32 dVar2;
  size_type sVar3;
  const_reference this;
  reference pvVar4;
  int local_8c;
  DataType local_84;
  int local_78;
  value_type local_58;
  int local_50;
  int local_4c;
  int alignment;
  int vecSize;
  DataType vecType;
  int numVecs;
  bool isMatrix;
  ulong uStack_38;
  DataType basicType;
  size_t ndx;
  undefined1 local_19;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *local_18;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values_local;
  ValueBufferLayout *layout;
  
  local_19 = 0;
  local_18 = values;
  values_local = (vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)__return_storage_ptr__;
  ValueBufferLayout::ValueBufferLayout(__return_storage_ptr__);
  sVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size(local_18);
  std::
  vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ::resize(&__return_storage_ptr__->entries,sVar3);
  for (uStack_38 = 0; uVar1 = uStack_38,
      sVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size(local_18),
      uVar1 < sVar3; uStack_38 = uStack_38 + 1) {
    this = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                     (local_18,uStack_38);
    numVecs = glu::VarType::getBasicType(&this->type);
    vecType._3_1_ = glu::isDataTypeMatrix(numVecs);
    if ((bool)vecType._3_1_) {
      local_78 = glu::getDataTypeMatrixNumColumns(numVecs);
    }
    else {
      local_78 = 1;
    }
    vecSize = local_78;
    if ((vecType._3_1_ & 1) == TYPE_INVALID >> 0x18) {
      local_84 = numVecs;
    }
    else {
      vecSize_00 = glu::getDataTypeMatrixNumRows(numVecs);
      local_84 = glu::getDataTypeFloatVec(vecSize_00);
    }
    alignment = local_84;
    local_4c = glu::getDataTypeScalarSize(local_84);
    if (((vecType._3_1_ & 1) != TYPE_INVALID >> 0x18) || (local_8c = local_4c, local_4c == 3)) {
      local_8c = 4;
    }
    local_50 = local_8c << 2;
    dVar2 = deAlign32(__return_storage_ptr__->size,local_50);
    __return_storage_ptr__->size = dVar2;
    ValueBufferLayout::Entry::Entry(&local_58,__return_storage_ptr__->size,local_50);
    pvVar4 = std::
             vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
             ::operator[](&__return_storage_ptr__->entries,uStack_38);
    *pvVar4 = local_58;
    __return_storage_ptr__->size =
         local_50 * (vecSize + -1) + local_4c * 4 + __return_storage_ptr__->size;
  }
  return __return_storage_ptr__;
}

Assistant:

ValueBufferLayout computeStd140Layout (const vector<Value>& values)
{
	ValueBufferLayout layout;

	layout.entries.resize(values.size());

	for (size_t ndx = 0; ndx < values.size(); ++ndx)
	{
		const DataType	basicType	= values[ndx].type.getBasicType();
		const bool		isMatrix	= isDataTypeMatrix(basicType);
		const int		numVecs		= isMatrix ? getDataTypeMatrixNumColumns(basicType) : 1;
		const DataType	vecType		= isMatrix ? glu::getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType)) : basicType;
		const int		vecSize		= getDataTypeScalarSize(vecType);
		const int		alignment	= ((isMatrix || vecSize == 3) ? 4 : vecSize)*int(sizeof(deUint32));

		layout.size			= deAlign32(layout.size, alignment);
		layout.entries[ndx] = ValueBufferLayout::Entry(layout.size, alignment);
		layout.size			+= alignment*(numVecs-1) + vecSize*int(sizeof(deUint32));
	}

	return layout;
}